

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetKeyOwner(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  
  pIVar2 = GImGui;
  if ((((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) &&
      (uVar1 = key - ImGuiKey_ModCtrl >> 0xc, uVar3 = key << 0x14 | uVar1, uVar3 < 8)) &&
     ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    key = *(ImGuiKey *)(&DAT_00259f90 + (ulong)uVar3 * 4);
  }
  iVar6 = key - ImGuiKey_NamedKey_BEGIN;
  GImGui->KeysOwnerData[iVar6].OwnerNext = owner_id;
  pIVar2->KeysOwnerData[iVar6].OwnerCurr = owner_id;
  bVar4 = (bool)((byte)flags >> 7);
  pIVar2->KeysOwnerData[iVar6].LockUntilRelease = bVar4;
  bVar5 = true;
  if ((flags & 0x40U) == 0) {
    bVar5 = bVar4;
  }
  pIVar2->KeysOwnerData[iVar6].LockThisFrame = bVar5;
  return;
}

Assistant:

inline ImGuiKeyOwnerData*   GetKeyOwnerData(ImGuiKey key)     { if (key & ImGuiMod_Mask_) key = ConvertSingleModFlagToKey(key); IM_ASSERT(IsNamedKey(key)); return &GImGui->KeysOwnerData[key - ImGuiKey_NamedKey_BEGIN]; }